

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

Bac_ObjType_t Bac_NameToType(char *pName)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  size_t __n;
  int local_1c;
  int i;
  char *pName_local;
  
  pcVar1 = s_Pref;
  sVar3 = strlen(s_Pref);
  iVar2 = strncmp(pName,pcVar1,sVar3);
  if (iVar2 == 0) {
    sVar3 = strlen(s_Pref);
    for (local_1c = 1; local_1c < 0x49; local_1c = local_1c + 1) {
      pcVar1 = s_Types[local_1c].pName;
      __n = strlen(s_Types[local_1c].pName);
      iVar2 = strncmp(pName + sVar3,pcVar1,__n);
      if (iVar2 == 0) {
        return s_Types[local_1c].Type;
      }
    }
  }
  return BAC_OBJ_NONE;
}

Assistant:

Bac_ObjType_t Bac_NameToType( char * pName )
{
    int i;
    if ( strncmp(pName, s_Pref, strlen(s_Pref)) )
        return BAC_OBJ_NONE;
    pName += strlen(s_Pref);
    for ( i = 1; i < BAC_BOX_UNKNOWN; i++ )
        if ( !strncmp(pName, s_Types[i].pName, strlen(s_Types[i].pName)) )
            return s_Types[i].Type;
    return BAC_OBJ_NONE;
}